

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O2

shared_ptr<gui::LabelStyle> __thiscall gui::DefaultTheme::makeLabelStyle(DefaultTheme *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<gui::LabelStyle> sVar1;
  Vector3f local_20;
  
  std::make_shared<gui::LabelStyle,gui::Gui_const&>((Gui *)this);
  LabelStyle::setFont((LabelStyle *)(this->super_Theme)._vptr_Theme,*(Font **)(in_RSI + 0x48));
  LabelStyle::setCharacterSize((LabelStyle *)(this->super_Theme)._vptr_Theme,0xf);
  LabelStyle::setTextFillColor
            ((LabelStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::Black);
  local_20.z = *(float *)(in_RSI + 0x50);
  local_20.x = 8.0;
  local_20.y = 1.0;
  LabelStyle::setTextPadding((LabelStyle *)(this->super_Theme)._vptr_Theme,&local_20);
  sVar1.super___shared_ptr<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::LabelStyle>)
         sVar1.super___shared_ptr<gui::LabelStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LabelStyle> DefaultTheme::makeLabelStyle() const {
    auto style = std::make_shared<LabelStyle>(gui_);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(sf::Color::Black);

    style->setTextPadding({8.0f, 1.0f, fontMaxHeightRatio_});

    return style;
}